

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber
          (Minefield_Response_NACK_PDU *this,KUINT8 N)

{
  KUINT8 local_11;
  Minefield_Response_NACK_PDU *pMStack_10;
  KUINT8 N_local;
  Minefield_Response_NACK_PDU *this_local;
  
  local_11 = N;
  pMStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vSeqNums,&local_11)
  ;
  this->m_ui8NumMisPdus = this->m_ui8NumMisPdus + '\x01';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength + 1;
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber( KUINT8 N )
{
    m_vSeqNums.push_back( N );
    ++m_ui8NumMisPdus;
    ++m_ui16PDULength;
}